

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

JavascriptFunction *
Js::StackScriptFunction::EnsureBoxed
          (JavascriptFunction *function,void *returnAddress,char16 *reason)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  BOOL BVar2;
  int iVar3;
  StackScriptFunction *stackScriptFunction;
  FunctionProxy *pFVar4;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  ScriptFunction *pSVar7;
  char16_t *pcVar8;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  bVar1 = ThreadContext::IsOnStack(function);
  pSVar7 = (ScriptFunction *)function;
  if (bVar1) {
    stackScriptFunction = VarTo<Js::StackScriptFunction,Js::JavascriptFunction>(function);
    pSVar7 = stackScriptFunction->boxedScriptFunction;
    if (stackScriptFunction->boxedScriptFunction == (ScriptFunction *)0x0) {
      pFVar4 = JavascriptFunction::GetFunctionProxy(function);
      sourceContextId = FunctionProxy::GetSourceContextId(pFVar4);
      pFVar4 = JavascriptFunction::GetFunctionProxy(function);
      functionId = FunctionProxy::GetLocalFunctionId(pFVar4);
      bVar1 = Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,sourceContextId,functionId);
      if (bVar1) {
        pFVar4 = JavascriptFunction::GetFunctionProxy(function);
        BVar2 = FunctionProxy::IsDeferredDeserializeFunction(pFVar4);
        if (BVar2 == 0) {
          pPVar5 = JavascriptFunction::GetParseableFunctionInfo(function);
          iVar3 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pPVar5);
          pcVar8 = (char16_t *)CONCAT44(extraout_var,iVar3);
        }
        else {
          pcVar8 = L"<DeferDeserialize>";
        }
        pFVar4 = JavascriptFunction::GetFunctionProxy(function);
        pcVar6 = FunctionProxy::GetDebugNumberSet(pFVar4,(wchar (*) [42])local_88);
        Output::Print(L"StackScriptFunction (%s): box and disable stack function: %s (function %s)\n"
                      ,reason,pcVar8,pcVar6);
        Output::Flush();
      }
      pSVar7 = Box(stackScriptFunction,returnAddress);
    }
  }
  return (JavascriptFunction *)pSVar7;
}

Assistant:

JavascriptFunction *
    StackScriptFunction::EnsureBoxed(BOX_PARAM(JavascriptFunction * function, void * returnAddress, char16 const * reason))
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        if (!ThreadContext::IsOnStack(function))
        {
            return function;
        }

        // Only script function can be on the stack
        StackScriptFunction * stackScriptFunction = VarTo<StackScriptFunction>(function);
        ScriptFunction * boxedFunction = stackScriptFunction->boxedScriptFunction;
        if (boxedFunction != nullptr)
        {
            // We have already boxed this stack function before, and the function
            // wasn't on any slot or not a caller that we can replace.
            // Just give out the function we boxed before
            return boxedFunction;
        }

        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, function->GetFunctionProxy(),
            _u("StackScriptFunction (%s): box and disable stack function: %s (function %s)\n"),
            reason, function->GetFunctionProxy()->IsDeferredDeserializeFunction()?
            _u("<DeferDeserialize>") : function->GetParseableFunctionInfo()->GetDisplayName(),
            function->GetFunctionProxy()->GetDebugNumberSet(debugStringBuffer));

        // During the box workflow we reset all the parents of all nested functions and up. If a fault occurs when the stack function
        // is created this will cause further issues when trying to use the function object again. So failing faster seems to make more sense
        try
        {
           boxedFunction = StackScriptFunction::Box(stackScriptFunction, returnAddress);
        }
        catch (Js::OutOfMemoryException)
        {
           FailedToBox_OOM_unrecoverable_error((ULONG_PTR)stackScriptFunction);
        }
        return boxedFunction;
    }